

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidySaveStdout(TidyDoc tdoc)

{
  int iVar1;
  StreamOut *out;
  
  out = prvTidyFileOutput((TidyDocImpl *)tdoc,(FILE *)_stdout,tdoc[0x94]._opaque,tdoc[0x8e]._opaque)
  ;
  iVar1 = tidyDocSaveStream((TidyDocImpl *)tdoc,out);
  fflush(_stdout);
  fflush(_stderr);
  (**(code **)(**(long **)(tdoc + 0xd18) + 0x10))(*(long **)(tdoc + 0xd18),out);
  return iVar1;
}

Assistant:

int TIDY_CALL        tidySaveStdout( TidyDoc tdoc )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocSaveStdout( doc );
}